

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O3

RtMidiApi rtmidi_compiled_api_by_name(char *name)

{
  RtMidiApi RVar1;
  size_t sVar2;
  string local_38;
  
  if (name == (char *)0x0) {
    RVar1 = RTMIDI_API_UNSPECIFIED;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar2 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,name,name + sVar2);
    RVar1 = RtMidi::getCompiledApiByName(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return RVar1;
}

Assistant:

enum RtMidiApi rtmidi_compiled_api_by_name(const char *name) {
    RtMidi::Api api = RtMidi::UNSPECIFIED;
    if (name) {
        api = RtMidi::getCompiledApiByName(name);
    }
    return (enum RtMidiApi)api;
}